

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::detail::GenericFeatureChain::combine(GenericFeatureChain *this,GenericFeatureChain *right)

{
  pointer pGVar1;
  pointer pGVar2;
  bool bVar3;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  pointer __x;
  GenericFeaturesPNextNode *left_node;
  pointer this_00;
  
  pGVar1 = (right->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (right->nodes).
             super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pGVar1; __x = __x + 1) {
    pGVar2 = (this->nodes).
             super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    for (this_00 = (this->nodes).
                   super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pGVar2;
        this_00 = this_00 + 1) {
      if (this_00->sType == __x->sType) {
        GenericFeaturesPNextNode::combine(this_00,__x);
        bVar3 = true;
      }
    }
    if (!bVar3) {
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::push_back(&this->nodes,__x);
    }
  }
  return;
}

Assistant:

void GenericFeatureChain::combine(GenericFeatureChain const& right) noexcept {
    for (const auto& right_node : right.nodes) {
        bool already_contained = false;
        for (auto& left_node : nodes) {
            if (left_node.sType == right_node.sType) {
                left_node.combine(right_node);
                already_contained = true;
            }
        }
        if (!already_contained) {
            nodes.push_back(right_node);
        }
    }
}